

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitCallRef
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,CallRef *curr)

{
  char **this_00;
  Name name;
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *pEVar2;
  Literal *pLVar3;
  Literals local_1a0;
  Literals local_168;
  undefined1 local_129;
  string_view local_128;
  Function *local_110;
  Function *func;
  Name funcName;
  Flow target;
  undefined1 local_a0 [8];
  Flow flow;
  Literals arguments;
  CallRef *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Flow *ret;
  
  this_00 = &flow.breakTo.super_IString.str._M_str;
  Literals::Literals((Literals *)this_00);
  pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::generateArguments
            ((Flow *)local_a0,pEVar2,&curr->operands,(Literals *)this_00);
  bVar1 = Flow::breaking((Flow *)local_a0);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_a0);
  }
  else {
    pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&funcName.super_IString.str._M_str,pEVar2,curr->target);
    bVar1 = Flow::breaking((Flow *)&funcName.super_IString.str._M_str);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&funcName.super_IString.str._M_str);
    }
    else {
      pLVar3 = Flow::getSingleValue((Flow *)&funcName.super_IString.str._M_str);
      bVar1 = wasm::Literal::isNull(pLVar3);
      if (bVar1) {
        (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                  (this,"null target in call_ref");
      }
      pLVar3 = Flow::getSingleValue((Flow *)&funcName.super_IString.str._M_str);
      local_128 = (string_view)wasm::Literal::getFunc(pLVar3);
      funcName.super_IString.str._M_len = (size_t)local_128._M_str;
      func = (Function *)local_128._M_len;
      local_110 = Module::getFunction(this->wasm,(Name)local_128);
      local_129 = 0;
      Flow::Flow(__return_storage_ptr__);
      bVar1 = Importable::imported(&local_110->super_Importable);
      if (bVar1) {
        (*this->externalInterface->_vptr_ExternalInterface[4])
                  (&local_168,this->externalInterface,local_110,
                   &flow.breakTo.super_IString.str._M_str);
        Literals::operator=(&__return_storage_ptr__->values,&local_168);
        Literals::~Literals(&local_168);
      }
      else {
        name.super_IString.str._M_str = (char *)funcName.super_IString.str._M_len;
        name.super_IString.str._M_len = (size_t)func;
        callFunctionInternal
                  (&local_1a0,this,name,(Literals *)&flow.breakTo.super_IString.str._M_str);
        Literals::operator=(&__return_storage_ptr__->values,&local_1a0);
        Literals::~Literals(&local_1a0);
      }
      if ((curr->isReturn & 1U) != 0) {
        wasm::Name::operator=(&__return_storage_ptr__->breakTo,(Name *)RETURN_FLOW);
      }
      local_129 = 1;
    }
    Flow::~Flow((Flow *)&funcName.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_a0);
  Literals::~Literals((Literals *)&flow.breakTo.super_IString.str._M_str);
  return __return_storage_ptr__;
}

Assistant:

Flow visitCallRef(CallRef* curr) {
    NOTE_ENTER("CallRef");
    Literals arguments;
    Flow flow = self()->generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    Flow target = self()->visit(curr->target);
    if (target.breaking()) {
      return target;
    }
    if (target.getSingleValue().isNull()) {
      trap("null target in call_ref");
    }
    Name funcName = target.getSingleValue().getFunc();
    auto* func = wasm.getFunction(funcName);
    Flow ret;
    if (func->imported()) {
      ret.values = externalInterface->callImport(func, arguments);
    } else {
      ret.values = callFunctionInternal(funcName, arguments);
    }
#ifdef WASM_INTERPRETER_DEBUG
    std::cout << "(returned to " << scope->function->name << ")\n";
#endif
    // TODO: make this a proper tail call (return first)
    if (curr->isReturn) {
      ret.breakTo = RETURN_FLOW;
    }
    return ret;
  }